

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O3

ParseResults __thiscall
bubbleJson::BubbleJson::ParseStringRaw(BubbleJson *this,char **refString,size_t *refLength)

{
  char cVar1;
  byte bVar2;
  BubbleContext *pBVar3;
  BubbleContext *pBVar4;
  uint uVar5;
  char *pcVar6;
  undefined1 *puVar7;
  ulong uVar8;
  size_t sVar9;
  BubbleJson *this_00;
  char *ch;
  uint highSurrogate;
  uint lowSurrogate;
  uint local_48;
  uint local_44;
  char **local_40;
  ulong *local_38;
  
  pBVar3 = this->context;
  local_40 = refString;
  local_38 = refLength;
  if (*pBVar3->json != '\"') {
    __assert_fail("*this->context->json == expectChar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                  ,0x38,"void bubbleJson::BubbleJson::Expect(const char)");
  }
  sVar9 = pBVar3->top;
  ch = pBVar3->json + 1;
  pBVar3->json = ch;
  this_00 = this;
LAB_0010ef8c:
  do {
    while( true ) {
      while (cVar1 = *ch, cVar1 != '\\') {
        if (cVar1 == '\0') {
          pBVar3->top = sVar9;
          return ParseResult_MissQuotationMark;
        }
        ch = ch + 1;
        if (cVar1 == '\"') {
          uVar8 = pBVar3->top - sVar9;
          pBVar4 = this->context;
          sVar9 = pBVar4->top - uVar8;
          if (uVar8 <= pBVar4->top) {
            pBVar4->top = sVar9;
            *local_40 = pBVar4->stack + sVar9;
            *local_38 = uVar8;
            pBVar3->json = ch;
            return ParseResult_Ok;
          }
          __assert_fail("this->context->top >= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                        ,0x11c,"void *bubbleJson::BubbleJson::ContextPop(size_t)");
        }
        if (cVar1 < ' ') {
          pBVar3->top = sVar9;
          return ParseResult_InvalidStringChar;
        }
        this_00 = this;
        pcVar6 = (char *)ContextPush(this,1);
        *pcVar6 = cVar1;
      }
      bVar2 = ch[1];
      ch = ch + 2;
      if (bVar2 < 0x62) break;
      switch(bVar2) {
      case 0x6e:
        this_00 = this;
        puVar7 = (undefined1 *)ContextPush(this,1);
        *puVar7 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_0010f007_caseD_6f;
      case 0x72:
        this_00 = this;
        puVar7 = (undefined1 *)ContextPush(this,1);
        *puVar7 = 0xd;
        break;
      case 0x74:
        this_00 = this;
        puVar7 = (undefined1 *)ContextPush(this,1);
        *puVar7 = 9;
        break;
      case 0x75:
        ch = ParseHexToInt(this_00,ch,&local_48);
        uVar5 = local_48;
        if (ch == (char *)0x0) {
LAB_0010f19d:
          pBVar3->top = sVar9;
          return ParseResult_InvalidUnicodeHex;
        }
        if ((local_48 & 0xfffffc00) == 0xd800) {
          if ((*ch != '\\') || (ch[1] != 'u')) {
LAB_0010f1a8:
            pBVar3->top = sVar9;
            return ParseResult_InvalidUnicodeSurrogate;
          }
          ch = ParseHexToInt(this_00,ch + 2,&local_44);
          if (ch == (char *)0x0) goto LAB_0010f19d;
          if (local_44 - 0xe000 < 0xfffffc00) goto LAB_0010f1a8;
          local_48 = uVar5 * 0x400 + local_44 + 0xfca02400;
        }
        this_00 = this;
        EncodeUTF8(this,local_48);
        break;
      default:
        if (bVar2 == 0x62) {
          this_00 = this;
          puVar7 = (undefined1 *)ContextPush(this,1);
          *puVar7 = 8;
        }
        else {
          if (bVar2 != 0x66) goto switchD_0010f007_caseD_6f;
          this_00 = this;
          puVar7 = (undefined1 *)ContextPush(this,1);
          *puVar7 = 0xc;
        }
      }
    }
    if (bVar2 == 0x22) {
      this_00 = this;
      puVar7 = (undefined1 *)ContextPush(this,1);
      *puVar7 = 0x22;
      goto LAB_0010ef8c;
    }
    if (bVar2 == 0x2f) {
      this_00 = this;
      puVar7 = (undefined1 *)ContextPush(this,1);
      *puVar7 = 0x2f;
    }
    else {
      if (bVar2 != 0x5c) {
switchD_0010f007_caseD_6f:
        pBVar3->top = sVar9;
        return ParseResult_InvalidStringEscape;
      }
      this_00 = this;
      puVar7 = (undefined1 *)ContextPush(this,1);
      *puVar7 = 0x5c;
    }
  } while( true );
}

Assistant:

ParseResults BubbleJson::ParseStringRaw(char **refString, size_t *refLength)
{
    BubbleContext* c = this->context;
    size_t originTop = c->top;
    size_t lenght;
    unsigned highSurrogate, lowSurrogate;

    auto ReturnError = [=,&c](ParseResults parseResult){
        c->top = originTop;
        return parseResult;
    };

    Expect('\"');
    const char* p = c->json;
    while (true)
    {
        //traverse json
        char ch = *p;
        p++;
        switch (ch)
        {
            case '\"':
                lenght = c->top - originTop;
                *refString = (char *) ContextPop(lenght);
                *refLength = lenght;
                //current p point '\"' character
                c->json = p;
                return ParseResult_Ok;
            case '\\':
                switch (*p++) {
                    case '\"':
                        ContextPushChar('\"'); break;
                    case '\\':
                        ContextPushChar('\\'); break;
                    case '/':
                        ContextPushChar('/'); break;
                    case 'b':
                        ContextPushChar('\b'); break;
                    case 'f':
                        ContextPushChar('\f'); break;
                    case 'n':
                        ContextPushChar('\n'); break;
                    case 'r':
                        ContextPushChar('\r'); break;
                    case 't':
                        ContextPushChar('\t'); break;
                    case 'u':
                        if (!(p = ParseHexToInt(p, &highSurrogate)))
                            return ReturnError(ParseResult_InvalidUnicodeHex);
                        if (highSurrogate >= 0xD800 && highSurrogate <= 0xDBFF)//surrogate pair
                        {
                            if (*p++ != '\\')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (*p++ != 'u')
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            if (!(p = ParseHexToInt(p, &lowSurrogate)))
                                return ReturnError(ParseResult_InvalidUnicodeHex);
                            if (lowSurrogate < 0xDC00 || lowSurrogate > 0xDFFF)
                                return ReturnError(ParseResult_InvalidUnicodeSurrogate);
                            highSurrogate = (((highSurrogate - 0xD800) << 10) | (lowSurrogate - 0xDC00)) + 0x10000;
                        }
                        EncodeUTF8(highSurrogate);
                        break;
                    default:
                        c->top = originTop;
                        return ParseResult_InvalidStringEscape;
                }
                break;
            case '\0':
                c->top = originTop;
                return ParseResult_MissQuotationMark;
            default:
                if (ch < 0x20)
                {
                    c->top = originTop;
                    return ParseResult_InvalidStringChar;
                }
                ContextPushChar(ch);
        }
    }
}